

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sz_compat.c
# Opt level: O0

int convert_options(int sz_opts)

{
  uint in_EDI;
  int i;
  int opts;
  int co [129];
  uint local_210;
  uint local_20c;
  uint local_208 [129];
  uint local_4;
  
  local_20c = 0;
  local_4 = in_EDI;
  memset(local_208,0,0x204);
  local_208[0x10] = 4;
  local_208[0x20] = 8;
  for (local_210 = 1; (int)local_210 < 0x81; local_210 = local_210 << 1) {
    if ((local_4 & local_210) != 0) {
      local_20c = local_208[(int)local_210] | local_20c;
    }
  }
  return local_20c;
}

Assistant:

static int convert_options(int sz_opts)
{
    int co[NOPTS];
    int opts = 0;

    memset(co, 0, sizeof(int) * NOPTS);
    co[SZ_MSB_OPTION_MASK] = AEC_DATA_MSB;
    co[SZ_NN_OPTION_MASK] = AEC_DATA_PREPROCESS;

    for (int i = 1; i < NOPTS; i <<= 1)
        if (sz_opts & i)
            opts |= co[i];

    return opts;
}